

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O1

void helper(string *tok,
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *temp,string *res)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  size_type sVar4;
  _Elt_pointer pbVar5;
  pointer pcVar6;
  int iVar7;
  _Elt_pointer pbVar8;
  ostream *poVar9;
  size_type sVar10;
  _Elt_pointer pbVar11;
  int iVar12;
  string *__range1;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (tok->_M_dataplus)._M_p;
  sVar4 = tok->_M_string_length;
  bVar13 = sVar4 == 0;
  if ((!bVar13) && ((int)*pcVar3 - 0x30U < 10)) {
    sVar10 = 1;
    do {
      bVar13 = sVar4 == sVar10;
      if (bVar13) break;
      pcVar1 = pcVar3 + sVar10;
      sVar10 = sVar10 + 1;
    } while ((int)*pcVar1 - 0x30U < 10);
  }
  if (bVar13) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar3,pcVar3 + sVar4);
    std::__cxx11::string::append((char *)local_50);
    std::__cxx11::string::_M_append((char *)res,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)tok);
    if (iVar7 == 0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp->c,tok);
      return;
    }
    iVar7 = std::__cxx11::string::compare((char *)tok);
    if (iVar7 == 0) {
      pbVar8 = (temp->c).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar8 != (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (pbVar8 == (temp->c).
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar8 = (temp->c).
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          iVar7 = std::__cxx11::string::compare((char *)(pbVar8 + -1));
          if (iVar7 == 0) break;
          pbVar8 = (temp->c).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pbVar8 == (temp->c).
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar8 = (temp->c).
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          std::__cxx11::string::_M_append((char *)res,(ulong)pbVar8[-1]._M_dataplus._M_p);
          std::__cxx11::string::append((char *)res);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&temp->c);
          pbVar8 = (temp->c).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        } while (pbVar8 != (temp->c).
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      if ((temp->c).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (temp->c).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"wrong bracer\n",0xd);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&temp->c);
      return;
    }
    bVar13 = is_bin(tok);
    if (!bVar13) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"invalid token ",0xe)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(tok->_M_dataplus)._M_p,tok->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      return;
    }
    pbVar8 = (temp->c).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar8 != (temp->c).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        pbVar5 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        pbVar11 = pbVar8;
        if (pbVar8 == pbVar5) {
          pbVar11 = (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        cVar2 = *pbVar11[-1]._M_dataplus._M_p;
        switch(cVar2) {
        case '*':
        case '/':
          iVar7 = 1;
          break;
        case '+':
        case '-':
          iVar7 = 0;
          break;
        case ',':
        case '.':
switchD_001025a0_caseD_2c:
          iVar7 = -1;
          break;
        default:
          iVar7 = 2;
          if (cVar2 != '^') goto switchD_001025a0_caseD_2c;
        }
        cVar2 = *(tok->_M_dataplus)._M_p;
        switch(cVar2) {
        case '*':
        case '/':
          iVar12 = 1;
          break;
        case '+':
        case '-':
          iVar12 = 0;
          break;
        case ',':
        case '.':
switchD_001025d8_caseD_2c:
          iVar12 = -1;
          break;
        default:
          iVar12 = 2;
          if (cVar2 != '^') goto switchD_001025d8_caseD_2c;
        }
        if (iVar7 < iVar12) break;
        pbVar11 = pbVar8;
        if (pbVar8 == pbVar5) {
          pbVar11 = (temp->c).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        if (*pbVar11[-1]._M_dataplus._M_p == '^') break;
        if (pbVar8 == pbVar5) {
          pbVar8 = (temp->c).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        pcVar6 = pbVar8[-1]._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar6,pcVar6 + pbVar8[-1]._M_string_length);
        std::__cxx11::string::append((char *)local_50);
        std::__cxx11::string::_M_append((char *)res,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&temp->c);
        pbVar8 = (temp->c).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pbVar8 != (temp->c).
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&temp->c,tok);
  }
  return;
}

Assistant:

void helper (const string& tok, stack<string>& temp, string& res) {
    if (is_num(tok)) res += tok + " ";
    else if (tok == "(") temp.push(tok);
    else if (tok == ")") {
        while (!temp.empty() && temp.top() != "(") {
            res += temp.top();
            res += " ";
            temp.pop();
        }
        if (temp.empty()) cout << "wrong bracer\n";
        temp.pop();
    } else if (is_bin(tok)) {
        while (!temp.empty() && (prior(temp.top()[0]) >= prior(tok[0])) && (prior(temp.top()[0]) != 2)) {
            res += temp.top() + " ";
            temp.pop();
        }
        temp.push(tok);
    } else cout << "invalid token " << tok << endl;
}